

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_ray(rf_ray ray,rf_color color)

{
  undefined1 local_c;
  undefined1 uStack_b;
  undefined1 uStack_a;
  undefined1 uStack_9;
  float scale;
  rf_color color_local;
  
  rf_gfx_begin(RF_LINES);
  local_c = color.r;
  uStack_b = color.g;
  uStack_a = color.b;
  uStack_9 = color.a;
  rf_gfx_color4ub(local_c,uStack_b,uStack_a,uStack_9);
  rf_gfx_color4ub(local_c,uStack_b,uStack_a,uStack_9);
  rf_gfx_vertex3f(ray.position.x,ray.position.y,ray.position.z);
  rf_gfx_vertex3f(ray.direction.x * 10000.0 + ray.position.x,
                  ray.direction.y * 10000.0 + ray.position.y,
                  ray.direction.z * 10000.0 + ray.position.z);
  rf_gfx_end();
  return;
}

Assistant:

RF_API void rf_draw_ray(rf_ray ray, rf_color color)
{
    float scale = 10000;

    rf_gfx_begin(RF_LINES);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);
    rf_gfx_color4ub(color.r, color.g, color.b, color.a);

    rf_gfx_vertex3f(ray.position.x, ray.position.y, ray.position.z);
    rf_gfx_vertex3f(ray.position.x + ray.direction.x*scale, ray.position.y + ray.direction.y*scale, ray.position.z + ray.direction.z*scale);
    rf_gfx_end();
}